

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbglxnativeinterfacehandler.cpp
# Opt level: O0

NativeResourceForContextFunction __thiscall
QXcbGlxNativeInterfaceHandler::nativeResourceFunctionForContext
          (QXcbGlxNativeInterfaceHandler *this,QByteArray *resource)

{
  int iVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  NativeResourceForContextFunction local_8;
  
  iVar1 = resourceType((QByteArray *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar1 == 0) {
    local_8 = glxConfigForContext;
  }
  else if (iVar1 == 1) {
    local_8 = glxContextForContext;
  }
  else {
    local_8 = (NativeResourceForContextFunction)0x0;
  }
  return local_8;
}

Assistant:

QPlatformNativeInterface::NativeResourceForContextFunction QXcbGlxNativeInterfaceHandler::nativeResourceFunctionForContext(const QByteArray &resource) const
{
    switch (resourceType(resource)) {
    case GLXConfig:
        return glxConfigForContext;
    case GLXContext:
        return glxContextForContext;
    default:
        break;
    }
    return nullptr;
}